

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,long,char_const*,unsigned_long>
               (char *args,path *args_1,char *args_2,long args_3,char *args_4,unsigned_long args_5)

{
  runtime_error *this;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  local_200 [32];
  path local_1e0;
  stringstream msg;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  Catch::clara::std::filesystem::__cxx11::path::path(&local_1e0,(path *)args_1);
  detail::
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  ::operator()(local_200,&msg,args,(path *)&local_1e0,args_2,args_3,args_4,args_5);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_1e0);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_200);
  *(undefined ***)this = &PTR__runtime_error_001b8a18;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}